

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O2

void PA5Application::keyCallback(GLFWwindow *window,int key,int param_3,int action,int param_5)

{
  PA5Application *this;
  
  this = (PA5Application *)glfwGetWindowUserPointer(window);
  if (key == 0x4e) {
    if ((uint)action < 2) {
      displayNormals = (bool)(displayNormals ^ 1);
    }
  }
  else if (key == 0x52) {
    computeView(this,true);
    return;
  }
  return;
}

Assistant:

void PA5Application::keyCallback(GLFWwindow * window, int key, int /*scancode*/, int action, int /*mods*/)
{
  PA5Application & app = *static_cast<PA5Application *>(glfwGetWindowUserPointer(window));
  switch (key) {
  case 'R':
    app.computeView(true);
    break;
  case 'N':
    if (action == GLFW_PRESS or action == GLFW_RELEASE) {
      displayNormals = not displayNormals;
    }
    break;
  }
}